

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApproxCheck.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_35b0::ApproxCheck::runOnFunction(ApproxCheck *this,Function *F)

{
  Value *b;
  StringRef Str;
  undefined8 instr_00;
  bool bVar1;
  raw_ostream *prVar2;
  reference ppVVar3;
  char *pcVar4;
  reference ppIVar5;
  pointer ppVar6;
  _Self local_180;
  _Self local_178;
  iterator i;
  Value *instr_1;
  __normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
  local_150;
  iterator i_4;
  Instruction *I_1;
  undefined1 local_138 [8];
  string newopcode;
  Value *v;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_108;
  iterator i_3;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_f8;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_f0;
  iterator i_2;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_e0;
  undefined1 local_c8 [8];
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> history;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string opcode;
  Instruction *instr;
  __normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
  local_68;
  iterator i_1;
  undefined1 local_58 [8];
  inst_iterator E;
  inst_iterator I;
  Function *F_local;
  ApproxCheck *this_local;
  
  prVar2 = (raw_ostream *)llvm::errs();
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"\n===================");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"Function ");
  Str = (StringRef)llvm::Value::getName();
  prVar2 = llvm::raw_ostream::operator<<(prVar2,Str);
  llvm::raw_ostream::operator<<(prVar2,"===================\n\n");
  llvm::inst_begin((inst_iterator *)&E.BI,F);
  llvm::inst_end((inst_iterator *)local_58,F);
  while (bVar1 = llvm::
                 InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                 ::operator!=((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                               *)&E.BI,(InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                                        *)local_58), bVar1) {
    i_1._M_current =
         (Instruction **)
         llvm::
         InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
         ::operator*((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                      *)&E.BI);
    std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::push_back
              (&this->worklist,(value_type *)&i_1);
    llvm::
    InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
    ::operator++((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                  *)&E.BI);
  }
  local_68._M_current =
       (Instruction **)
       std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::begin
                 (&this->worklist);
  while( true ) {
    instr = (Instruction *)
            std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::end
                      (&this->worklist);
    bVar1 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
                        *)&instr);
    if (!bVar1) break;
    ppIVar5 = __gnu_cxx::
              __normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
              ::operator*(&local_68);
    opcode.field_2._8_8_ = *ppIVar5;
    pcVar4 = llvm::Instruction::getOpcodeName((Instruction *)opcode.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar4,&local_99);
    std::allocator<char>::~allocator(&local_99);
    bVar1 = llvm::Instruction::mayReadOrWriteMemory((Instruction *)opcode.field_2._8_8_);
    if (((bVar1) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_98,"br"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"ret"), bVar1)) {
      std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                ((vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_c8);
      instr_00 = opcode.field_2._8_8_;
      std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                (&local_e0,
                 (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_c8);
      checkUseChain(this,(Instruction *)instr_00,1,&local_e0);
      std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::~vector(&local_e0);
      std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::~vector
                ((vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_c8);
    }
    std::__cxx11::string::~string((string *)local_98);
    i_2._M_current =
         (Value **)
         __gnu_cxx::
         __normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
         ::operator++(&local_68,0);
  }
  local_f0._M_current =
       (Value **)std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin(&this->addrList);
  while( true ) {
    local_f8._M_current =
         (Value **)std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end(&this->addrList);
    bVar1 = __gnu_cxx::operator<(&local_f0,&local_f8);
    if (!bVar1) break;
    prVar2 = (raw_ostream *)llvm::errs();
    ppVVar3 = __gnu_cxx::
              __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
              ::operator*(&local_f0);
    prVar2 = llvm::operator<<(prVar2,*ppVVar3);
    llvm::raw_ostream::operator<<(prVar2,"\n");
    i_3._M_current =
         (Value **)
         __gnu_cxx::
         __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
         ::operator++(&local_f0,0);
  }
  local_108._M_current =
       (Value **)std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin(&this->addrList);
  while( true ) {
    v = (Value *)std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end(&this->addrList);
    bVar1 = __gnu_cxx::operator<
                      (&local_108,
                       (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                        *)&v);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
              ::operator*(&local_108);
    newopcode.field_2._8_8_ = *ppVVar3;
    useAsData(this,(Value *)newopcode.field_2._8_8_,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,"",(allocator<char> *)((long)&I_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&I_1 + 7));
    bVar1 = llvm::isa<llvm::Instruction,llvm::Value*>((Value **)((long)&newopcode.field_2 + 8));
    if (bVar1) {
      i_4._M_current =
           (Instruction **)
           llvm::dyn_cast<llvm::Instruction,llvm::Value>((Value *)newopcode.field_2._8_8_);
      pcVar4 = llvm::Instruction::getOpcodeName((Instruction *)i_4._M_current);
      std::__cxx11::string::operator=((string *)local_138,pcVar4);
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,"alloca");
    if (bVar1) {
      local_150._M_current =
           (Instruction **)
           std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::begin
                     (&this->worklist);
      while( true ) {
        instr_1 = (Value *)std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::
                           end(&this->worklist);
        bVar1 = __gnu_cxx::operator!=
                          (&local_150,
                           (__normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
                            *)&instr_1);
        if (!bVar1) break;
        ppIVar5 = __gnu_cxx::
                  __normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
                  ::operator*(&local_150);
        b = (Value *)*ppIVar5;
        bVar1 = hasSameOperands(this,(Value *)newopcode.field_2._8_8_,b,false);
        if (bVar1) {
          useAsData(this,b,1);
        }
        __gnu_cxx::
        __normal_iterator<llvm::Instruction_**,_std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>_>
        ::operator++(&local_150,0);
      }
    }
    std::__cxx11::string::~string((string *)local_138);
    i._M_node = (_Base_ptr)
                __gnu_cxx::
                __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                ::operator++(&local_108,0);
  }
  countOpcodes(this,F);
  local_178._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
       ::begin(&this->opCounter);
  while( true ) {
    local_180._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
         ::end(&this->opCounter);
    bVar1 = std::operator!=(&local_178,&local_180);
    if (!bVar1) break;
    prVar2 = (raw_ostream *)llvm::errs();
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
             ::operator->(&local_178);
    prVar2 = llvm::raw_ostream::operator<<(prVar2,&ppVar6->first);
    prVar2 = llvm::raw_ostream::operator<<(prVar2,": ");
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
             ::operator->(&local_178);
    prVar2 = llvm::raw_ostream::operator<<(prVar2,(ppVar6->second).second);
    prVar2 = llvm::raw_ostream::operator<<(prVar2,"/");
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
             ::operator->(&local_178);
    prVar2 = llvm::raw_ostream::operator<<(prVar2,(ppVar6->second).first);
    llvm::raw_ostream::operator<<(prVar2," can be approximated\n");
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
    ::operator++(&local_178,0);
  }
  prVar2 = (raw_ostream *)llvm::errs();
  llvm::raw_ostream::operator<<(prVar2,"\n");
  std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::clear(&this->worklist);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  ::clear(&this->opCounter);
  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::clear(&this->addrList);
  return false;
}

Assistant:

virtual bool runOnFunction(Function &F) {
			errs() << "\n===================" << "Function " << F.getName() << "===================\n\n";

			for (inst_iterator I = inst_begin(F), E = inst_end(F); I != E; ++I) {
				worklist.push_back(&*I);
			}

			// Step 1) Find all places where an address is being used.
			// Step 2) If the address is stored in memory, locate the addresses that point to those memory locations.
			for(std::vector<Instruction*>::iterator i = worklist.begin(); i != worklist.end(); i++) {
				Instruction* instr = *i;
				std::string opcode = instr->getOpcodeName();
				if (instr->mayReadOrWriteMemory() || opcode == "br" || opcode == "ret") {
					// errs() << "(0)" << *instr << "\n";
					std::vector<Instruction*> history;
					checkUseChain(instr, 1, history);
				}
			}

			for (std::vector<Value*>::iterator i = addrList.begin(); i < addrList.end(); i++) {
				errs() << **i << "\n";
			}

			// Step 3) Find all places where the address is being operated on.
			for (std::vector<Value*>::iterator i = addrList.begin(); i < addrList.end(); i++) {
				Value* v = *i;
				useAsData(v, 1);

				// alloca is a special case. We do not want to let it check against all local variables of the same type.
				std::string newopcode = "";
				if (isa<Instruction>(v)) {
					Instruction *I = dyn_cast<Instruction>(v);
					newopcode = I->getOpcodeName();
				}

				if (newopcode != "alloca") {
					for(std::vector<Instruction*>::iterator i = worklist.begin(); i != worklist.end(); i++) {
						Value* instr = *i;
						if (hasSameOperands(v, instr, false)) {
							// errs() << "(0)" << *instr << "\n";
							useAsData(instr, 1);
						}
					}
				}
			}

			countOpcodes(F);

			// Print approx counts
			std::map <std::string, std::pair<int, int>>::iterator i = opCounter.begin();
			while (i != opCounter.end()) {
				errs() << i->first << ": " << i->second.second << "/" << i->second.first << " can be approximated\n";
				i++;
			}
			errs() << "\n";


			worklist.clear();
			opCounter.clear();
			addrList.clear();
			return false;
		}